

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vreg_assignment.cpp
# Opt level: O1

int __thiscall mocker::VRegAssignment::init(VRegAssignment *this,EVP_PKEY_CTX *ctx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<mocker::ir::Addr> *psVar1;
  Register *pRVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long *plVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  mapped_type *pmVar7;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  size_type *psVar8;
  undefined8 *puVar9;
  long lVar10;
  shared_ptr<mocker::ir::Addr> *addr;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Reg> dest;
  element_type *local_c0;
  undefined1 local_b1;
  element_type *local_b0;
  Register *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  element_type *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  long *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar6 = *(element_type **)(ctx + 0x38);
  local_b0 = (element_type *)(ctx + 0x38);
  if (peVar6 != local_b0) {
    do {
      for (puVar9 = (undefined8 *)(peVar6->identifier).field_2._M_allocated_capacity;
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9 != &(peVar6->identifier).field_2; puVar9 = (undefined8 *)*puVar9) {
        ir::getDest((ir *)&local_60,(shared_ptr<mocker::ir::IRInst> *)(puVar9 + 2));
        if (local_60 != 0) {
          std::operator+(&local_50,"vir_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_60 + 8));
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar8 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_98.field_2._M_allocated_capacity = *psVar8;
            local_98.field_2._8_8_ = plVar4[3];
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar8;
            local_98._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_98._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          local_a8 = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,std::__cxx11::string>
                    (&_Stack_a0,&local_a8,(allocator<mocker::nasm::Register> *)&local_b1,&local_98);
          pmVar5 = std::__detail::
                   _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,(key_type *)&local_60);
          _Var3._M_pi = _Stack_a0._M_pi;
          pRVar2 = local_a8;
          local_a8 = (Register *)0x0;
          _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (pmVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount._M_pi;
          (pmVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               pRVar2;
          (pmVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi = _Var3._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
      }
      peVar6 = (element_type *)(peVar6->super_Addr)._vptr_Addr;
    } while (peVar6 != local_b0);
  }
  local_78 = ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
             &local_b0->super_Addr)->_M_ptr;
  peVar6 = local_b0;
  if (local_78 != local_b0) {
    do {
      peVar6 = (element_type *)&(local_78->identifier).field_2;
      local_68 = (long *)(local_78->identifier).field_2._M_allocated_capacity;
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)peVar6;
      if ((element_type *)local_68 != peVar6) {
        do {
          lVar10 = local_68[2];
          if (*(int *)(lVar10 + 8) == 0xf) {
            local_c0 = (element_type *)local_68[3];
            if (local_c0 != (element_type *)0x0) {
              peVar6 = local_c0;
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(local_c0->identifier)._M_dataplus._M_p =
                     *(int *)&(local_c0->identifier)._M_dataplus._M_p + 1;
                UNLOCK();
              }
              else {
                *(int *)&(local_c0->identifier)._M_dataplus._M_p =
                     *(int *)&(local_c0->identifier)._M_dataplus._M_p + 1;
              }
            }
          }
          else {
            lVar10 = 0;
            local_c0 = (element_type *)0x0;
          }
          if (lVar10 != 0) {
            addr = *(shared_ptr<mocker::ir::Addr> **)(lVar10 + 0x28);
            psVar1 = *(shared_ptr<mocker::ir::Addr> **)(lVar10 + 0x30);
            if (addr != psVar1) {
              do {
                ir::dycLocalReg((ir *)&local_98,addr);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  __assert_fail("reg",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/vreg_assignment.cpp"
                                ,0x1c,
                                "void mocker::VRegAssignment::init(const ir::FunctionModule &)");
                }
                pmVar5 = std::__detail::
                         _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)this,(key_type *)&local_98);
                peVar6 = (element_type *)
                         std::__detail::
                         _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)this,(key_type *)(lVar10 + 0x18));
                if ((pmVar5->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr !=
                    (element_type *)
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&peVar6->super_Addr)->_M_allocated_capacity) {
                  pmVar5 = std::__detail::
                           _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)this,(key_type *)(lVar10 + 0x18));
                  pmVar7 = std::__detail::
                           _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)this,(key_type *)&local_98);
                  (pmVar7->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (pmVar5->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  peVar6 = (element_type *)
                           std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                                     (&(pmVar7->
                                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_refcount,
                                      &(pmVar5->
                                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_refcount);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_98._M_string_length);
                  peVar6 = extraout_RAX;
                }
                addr = addr + 2;
              } while (addr != psVar1);
            }
          }
          if (local_c0 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0);
            peVar6 = extraout_RAX_00;
          }
          local_68 = (long *)*local_68;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_68 != local_70);
      }
      local_78 = ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_78->super_Addr)->_M_ptr;
    } while (local_78 != local_b0);
  }
  return (int)peVar6;
}

Assistant:

void VRegAssignment::init(const ir::FunctionModule &func) {
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      mp[dest] = std::make_shared<nasm::Register>("vir_" +
          dest->getIdentifier() + "_");
    }
  }

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        continue;

      for (auto &option : phi->getOptions()) {
        auto reg = ir::dycLocalReg(option.first);
        assert(reg);
        if (mp[reg] != mp[phi->getDest()]) {
          mp[reg] = mp[phi->getDest()];
        }
      }
    }
  }
}